

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenAtomicWaitSetTimeout(BinaryenExpressionRef expr,BinaryenExpressionRef timeoutExpr)

{
  if (expr->_id != AtomicWaitId) {
    __assert_fail("expression->is<AtomicWait>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0xc2b,
                  "void BinaryenAtomicWaitSetTimeout(BinaryenExpressionRef, BinaryenExpressionRef)")
    ;
  }
  if (timeoutExpr != (BinaryenExpressionRef)0x0) {
    expr[2].type.id = (uintptr_t)timeoutExpr;
    return;
  }
  __assert_fail("timeoutExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0xc2c,
                "void BinaryenAtomicWaitSetTimeout(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenAtomicWaitSetTimeout(BinaryenExpressionRef expr,
                                  BinaryenExpressionRef timeoutExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<AtomicWait>());
  assert(timeoutExpr);
  static_cast<AtomicWait*>(expression)->timeout = (Expression*)timeoutExpr;
}